

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O2

bool absl::time_internal::cctz::time_zone::Impl::LoadTimeZone(string *name,time_zone *tz)

{
  unique_ptr<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
  uVar1;
  bool bVar2;
  _Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
  _Var3;
  pthread_mutex_t *ppVar4;
  iterator iVar5;
  __uniq_ptr_data<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>,_true,_true>
  this;
  tuple<const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
  *ptVar6;
  pointer __p;
  byte unaff_BPL;
  unique_ptr<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
  new_impl;
  _Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false> local_40;
  duration<long,_std::ratio<1L,_1L>_> offset;
  
  _Var3.super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>.
  _M_head_impl = (_Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>)
                 UTCImpl();
  offset.__r = 0;
  bVar2 = FixedOffsetFromName(name,&offset);
  if ((bVar2) && (offset.__r == 0)) {
    tz->impl_ = (Impl *)_Var3.
                        super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                        ._M_head_impl;
    unaff_BPL = 1;
  }
  else {
    ppVar4 = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
    std::mutex::lock((mutex *)&ppVar4->__data);
    bVar2 = true;
    if ((anonymous_namespace)::time_zone_map_abi_cxx11_ !=
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((anonymous_namespace)::time_zone_map_abi_cxx11_,name);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_true>
          ._M_cur != (__node_type *)0x0) {
        tz->impl_ = *(Impl **)((long)iVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_true>
                                     ._M_cur + 0x28);
        unaff_BPL = (_Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>)
                    *(Impl **)((long)iVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_true>
                                     ._M_cur + 0x28) !=
                    _Var3.
                    super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                    ._M_head_impl;
        bVar2 = false;
      }
    }
    pthread_mutex_unlock(ppVar4);
    if (bVar2) {
      this.
      super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
      .super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>._M_head_impl
           = (__uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
              )operator_new(0x28);
      Impl((Impl *)this.
                   super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                   .super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                   ._M_head_impl,name);
      new_impl._M_t.
      super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
      .super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>._M_head_impl
           = (__uniq_ptr_data<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>,_true,_true>
              )(__uniq_ptr_data<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>,_true,_true>
                )this.
                 super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                 .super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>.
                 _M_head_impl;
      ppVar4 = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
      std::mutex::lock((mutex *)&ppVar4->__data);
      if ((anonymous_namespace)::time_zone_map_abi_cxx11_ ==
          (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)0x0) {
        (anonymous_namespace)::time_zone_map_abi_cxx11_ =
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)operator_new(0x38);
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_buckets =
             &(anonymous_namespace)::time_zone_map_abi_cxx11_->_M_single_bucket;
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_bucket_count = 1;
        ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_before_begin)._M_nxt =
             (_Hash_node_base *)0x0;
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_element_count = 0;
        ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_rehash_policy)._M_max_load_factor = 1.0
        ;
        ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_rehash_policy)._M_next_resize = 0;
        (anonymous_namespace)::time_zone_map_abi_cxx11_->_M_single_bucket = (__node_base_ptr)0x0;
      }
      ptVar6 = (tuple<const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                *)std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)(anonymous_namespace)::time_zone_map_abi_cxx11_,name);
      uVar1 = new_impl;
      local_40._M_head_impl =
           *(Impl **)&ptVar6->
                      super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
      ;
      if ((_Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>)
          local_40._M_head_impl ==
          (_Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>)0x0) {
        local_40._M_head_impl =
             (Impl *)_Var3.
                     super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                     ._M_head_impl;
        if (*(long *)((long)new_impl._M_t.
                            super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                            .
                            super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                            ._M_head_impl + 0x20) != 0) {
          new_impl._M_t.
          super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
          .super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>.
          _M_head_impl = (__uniq_ptr_data<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>,_true,_true>
                          )(__uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                            )0x0;
          local_40._M_head_impl =
               (Impl *)uVar1._M_t.
                       super___uniq_ptr_impl<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                       .
                       super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                       ._M_head_impl;
        }
        ptVar6->
        super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
             = (_Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                )local_40._M_head_impl;
      }
      tz->impl_ = local_40._M_head_impl;
      unaff_BPL = (_Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>)
                  *(Impl **)&ptVar6->
                             super__Tuple_impl<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
                  != _Var3.
                     super__Head_base<0UL,_const_absl::time_internal::cctz::time_zone::Impl_*,_false>
                     ._M_head_impl;
      pthread_mutex_unlock(ppVar4);
      std::
      unique_ptr<const_absl::time_internal::cctz::time_zone::Impl,_std::default_delete<const_absl::time_internal::cctz::time_zone::Impl>_>
      ::~unique_ptr(&new_impl);
    }
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool time_zone::Impl::LoadTimeZone(const std::string& name, time_zone* tz) {
  const Impl* const utc_impl = UTCImpl();

  // Check for UTC (which is never a key in time_zone_map).
  auto offset = seconds::zero();
  if (FixedOffsetFromName(name, &offset) && offset == seconds::zero()) {
    *tz = time_zone(utc_impl);
    return true;
  }

  // Check whether the time zone has already been loaded.
  {
    std::lock_guard<std::mutex> lock(TimeZoneMutex());
    if (time_zone_map != nullptr) {
      TimeZoneImplByName::const_iterator itr = time_zone_map->find(name);
      if (itr != time_zone_map->end()) {
        *tz = time_zone(itr->second);
        return itr->second != utc_impl;
      }
    }
  }

  // Load the new time zone (outside the lock).
  std::unique_ptr<const Impl> new_impl(new Impl(name));

  // Add the new time zone to the map.
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map == nullptr) time_zone_map = new TimeZoneImplByName;
  const Impl*& impl = (*time_zone_map)[name];
  if (impl == nullptr) {  // this thread won any load race
    impl = new_impl->zone_ ? new_impl.release() : utc_impl;
  }
  *tz = time_zone(impl);
  return impl != utc_impl;
}